

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::SmallSpanSequence::GetMatchingStatementFromBytecode
          (SmallSpanSequence *this,int bytecode,SmallSpanSequenceIter *iter,StatementData *data)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  int local_34;
  StatementData *pSStack_30;
  int countOfMissed;
  StatementData *data_local;
  SmallSpanSequenceIter *iter_local;
  SmallSpanSequence *pSStack_18;
  int bytecode_local;
  SmallSpanSequence *this_local;
  
  pSStack_30 = data;
  data_local = (StatementData *)iter;
  iter_local._4_4_ = bytecode;
  pSStack_18 = this;
  uVar4 = Count(this);
  if ((uVar4 != 0) && (-1 < iter_local._4_4_)) {
    if ((iter_local._4_4_ < data_local[1].sourceBegin) ||
       ((data_local->sourceBegin < 1 ||
        (uVar1 = data_local->sourceBegin, uVar4 = Count(this), uVar4 <= uVar1)))) {
      Reset(this,(SmallSpanSequenceIter *)data_local);
    }
    while (uVar1 = data_local->sourceBegin, uVar4 = Count(this), uVar1 < uVar4) {
      local_34 = 0;
      BVar5 = GetRangeAt(this,data_local->sourceBegin,(SmallSpanSequenceIter *)data_local,&local_34,
                         pSStack_30);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1594,"(0)","FALSE");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
        break;
      }
      if (iter_local._4_4_ <= pSStack_30->bytecodeBegin) {
        if (iter_local._4_4_ < pSStack_30->bytecodeBegin) {
          pSStack_30->sourceBegin = data_local->bytecodeBegin;
          pSStack_30->bytecodeBegin = data_local[1].sourceBegin;
        }
        return 1;
      }
      data_local->bytecodeBegin = pSStack_30->sourceBegin;
      data_local[1].sourceBegin = pSStack_30->bytecodeBegin;
      data_local->sourceBegin = data_local->sourceBegin + 1;
      if (local_34 != 0) {
        data_local[1].bytecodeBegin = local_34 + data_local[1].bytecodeBegin;
      }
    }
    if (data_local->sourceBegin != -1) {
      if (iter_local._4_4_ <= pSStack_30->bytecodeBegin) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x15b2,"(data.bytecodeBegin < bytecode)",
                                    "data.bytecodeBegin < bytecode");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      return 1;
    }
  }
  data_local->sourceBegin = -1;
  return 0;
}

Assistant:

BOOL SmallSpanSequence::GetMatchingStatementFromBytecode(int bytecode, SmallSpanSequenceIter &iter, StatementData & data)
    {
        if (Count() > 0 && bytecode >= 0)
        {
            // Support only in forward direction
            if (bytecode < iter.accumulatedBytecodeBegin
                || iter.accumulatedIndex <= 0 || (uint32)iter.accumulatedIndex >= Count())
            {
                // re-initialize the accumulators
                Reset(iter);
            }

            while ((uint32)iter.accumulatedIndex < Count())
            {
                int countOfMissed = 0;
                if (!GetRangeAt(iter.accumulatedIndex, iter, &countOfMissed, data))
                {
                    Assert(FALSE);
                    break;
                }

                if (data.bytecodeBegin >= bytecode)
                {
                    if (data.bytecodeBegin > bytecode)
                    {
                        // Not exactly at the current bytecode, so it falls in between previous statement.
                        data.sourceBegin = iter.accumulatedSourceBegin;
                        data.bytecodeBegin = iter.accumulatedBytecodeBegin;
                    }

                    return TRUE;
                }

                // Look for the next
                iter.accumulatedSourceBegin = data.sourceBegin;
                iter.accumulatedBytecodeBegin = data.bytecodeBegin;
                iter.accumulatedIndex++;

                if (countOfMissed)
                {
                    iter.indexOfActualOffset += countOfMissed;
                }
            }

            if (iter.accumulatedIndex != -1)
            {
                // Give the last one.
                Assert(data.bytecodeBegin < bytecode);
                return TRUE;
            }
        }

        // Failed to give the correct one, init to default
        iter.accumulatedIndex = -1;
        return FALSE;
    }